

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O2

bool __thiscall
ON_Annotation::RunReplaceString
          (ON_Annotation *this,ON_DimStyle *dimstyle,wchar_t *repl_str,int start_run_idx,
          int start_run_pos,int end_run_idx,int end_run_pos)

{
  ON_TextContent *this_00;
  bool bVar1;
  
  this_00 = this->m_text;
  if (this_00 == (ON_TextContent *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = ON_TextContent::RunReplaceString
                      (this_00,repl_str,start_run_idx,start_run_pos,end_run_idx,end_run_pos);
    ON_TextContent::ComposeText(this_00);
    ON_TextContent::RebuildRuns(this_00,this->m_annotation_type,dimstyle);
  }
  return bVar1;
}

Assistant:

ON_TextContent* ON_Annotation::Text()
{
  return m_text;
}